

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O3

void __thiscall
capnp::anon_unknown_1::CppTypeName::addMemberType(CppTypeName *this,StringPtr innerName)

{
  size_t sVar1;
  ArrayDisposer *pAVar2;
  Branch *pBVar3;
  char *pcVar4;
  ArrayPtr<const_char> *in_R8;
  StringTree local_68;
  ArrayPtr<const_char> local_30;
  char *local_20;
  char *local_18;
  
  local_30.ptr = innerName.content.ptr;
  local_20 = "::";
  local_18 = (char *)0x2;
  local_30.size_ = innerName.content.size_ - 1;
  kj::StringTree::concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (&local_68,&this->name,(StringTree *)&stack0xffffffffffffffe0,&local_30,in_R8);
  (this->name).size_ = local_68.size_;
  pcVar4 = (this->name).text.content.ptr;
  if (pcVar4 != (char *)0x0) {
    sVar1 = (this->name).text.content.size_;
    (this->name).text.content.ptr = (char *)0x0;
    (this->name).text.content.size_ = 0;
    pAVar2 = (this->name).text.content.disposer;
    (**pAVar2->_vptr_ArrayDisposer)(pAVar2,pcVar4,1,sVar1,sVar1,0);
  }
  (this->name).text.content.ptr = local_68.text.content.ptr;
  (this->name).text.content.size_ = local_68.text.content.size_;
  (this->name).text.content.disposer = local_68.text.content.disposer;
  local_68.text.content.ptr = (char *)0x0;
  local_68.text.content.size_ = 0;
  pBVar3 = (this->name).branches.ptr;
  if (pBVar3 == (Branch *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    sVar1 = (this->name).branches.size_;
    (this->name).branches.ptr = (Branch *)0x0;
    (this->name).branches.size_ = 0;
    pAVar2 = (this->name).branches.disposer;
    (**pAVar2->_vptr_ArrayDisposer)
              (pAVar2,pBVar3,0x40,sVar1,sVar1,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pcVar4 = local_68.text.content.ptr;
  }
  sVar1 = local_68.text.content.size_;
  (this->name).branches.ptr = local_68.branches.ptr;
  (this->name).branches.size_ = local_68.branches.size_;
  (this->name).branches.disposer = local_68.branches.disposer;
  local_68.branches.ptr = (Branch *)0x0;
  local_68.branches.size_ = 0;
  if (pcVar4 != (char *)0x0) {
    local_68.text.content.ptr = (char *)0x0;
    local_68.text.content.size_ = 0;
    (**(local_68.text.content.disposer)->_vptr_ArrayDisposer)
              (local_68.text.content.disposer,pcVar4,1,sVar1,sVar1,0);
  }
  this->needsTypename = this->isArgDependent;
  return;
}

Assistant:

void addMemberType(kj::StringPtr innerName) {
    // Append "::innerName" to refer to a member.

    name = kj::strTree(kj::mv(name), "::", innerName);
    needsTypename = isArgDependent;
  }